

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void R_DrawTiltedPlane(visplane_t *pl,double _xscale,double _yscale,fixed_t alpha,bool additive,
                      bool masked)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int local_f4;
  undefined1 local_f0 [4];
  int i;
  TVector3<float> local_dc;
  TVector3<float> local_d0;
  TVector3<float> local_c4;
  TAngle<double> local_b8;
  TAngle<double> local_b0;
  TVector2<double> local_a8;
  double local_98;
  double zeroheight;
  double sine;
  double cosine;
  double planeang;
  double ang;
  FVector3 n;
  FVector3 m;
  FVector3 p;
  double yscale;
  double xscale;
  double lyscale;
  double lxscale;
  bool masked_local;
  bool additive_local;
  fixed_t alpha_local;
  double _yscale_local;
  double _xscale_local;
  visplane_t *pl_local;
  
  TVector3<float>::TVector3((TVector3<float> *)&m.Y);
  TVector3<float>::TVector3((TVector3<float> *)&n.Y);
  TVector3<float>::TVector3((TVector3<float> *)((long)&ang + 4));
  if (0 < alpha) {
    fVar1 = R_DrawTiltedPlane::ifloatpow2[ds_xbits];
    fVar2 = R_DrawTiltedPlane::ifloatpow2[ds_ybits];
    dVar5 = 64.0 / (_xscale * (double)fVar1);
    dVar6 = 64.0 / (_yscale * (double)fVar2);
    TVector2<double>::TVector2(&local_a8,&ViewPos);
    local_98 = secplane_t::ZatPoint(&pl->height,&local_a8);
    pviewx = xs_ToFixed(0x20 - ds_xbits,(real64)((pl->xform).xOffs * (pl->xform).xScale));
    pviewy = xs_ToFixed(0x20 - ds_ybits,(real64)((pl->xform).yOffs * (pl->xform).yScale));
    TAngle<double>::TAngle(&local_b8,&(pl->xform).baseAngle);
    TAngle<double>::operator+(&local_b0,&(pl->xform).Angle);
    cosine = TAngle<double>::Radians(&local_b0);
    dVar7 = TAngle<double>::Radians(&ViewAngle);
    planeang = 4.71238898038469 - dVar7;
    sine = cos(planeang);
    zeroheight = sin(planeang);
    dVar7 = ViewPos.X * sine;
    dVar8 = ViewPos.Y * zeroheight;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)&m.Y,0);
    *pfVar4 = (float)(dVar7 - dVar8);
    dVar7 = ViewPos.X * zeroheight;
    dVar8 = ViewPos.Y * sine;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)&m.Y,2);
    *pfVar4 = (float)(dVar7 + dVar8);
    dVar7 = secplane_t::ZatPoint(&pl->height,0.0,0.0);
    dVar7 = dVar7 - ViewPos.Z;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)&m.Y,1);
    *pfVar4 = (float)dVar7;
    planeang = (planeang - 1.5707963267948966) - cosine;
    sine = cos(planeang);
    zeroheight = sin(planeang);
    dVar7 = dVar6 * sine;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)&n.Y,0);
    *pfVar4 = (float)dVar7;
    dVar7 = dVar6 * zeroheight;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)&n.Y,2);
    *pfVar4 = (float)dVar7;
    dVar7 = dVar5 * zeroheight;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)((long)&ang + 4),0);
    *pfVar4 = (float)dVar7;
    dVar7 = -dVar5 * sine;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)((long)&ang + 4),2);
    *pfVar4 = (float)dVar7;
    sine = cos(cosine);
    zeroheight = sin(cosine);
    dVar6 = secplane_t::ZatPoint
                      (&pl->height,ViewPos.X + dVar6 * zeroheight,ViewPos.Y + dVar6 * sine);
    dVar6 = dVar6 - local_98;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)&n.Y,1);
    *pfVar4 = (float)dVar6;
    dVar5 = secplane_t::ZatPoint
                      (&pl->height,ViewPos.X - dVar5 * sine,ViewPos.Y + dVar5 * zeroheight);
    dVar5 = dVar5 - local_98;
    pfVar4 = TVector3<float>::operator[]((TVector3<float> *)((long)&ang + 4),1);
    *pfVar4 = (float)-dVar5;
    TVector3<float>::operator^(&local_c4,(TVector3<float> *)&m.Y);
    TVector3<float>::operator=(&plane_su,&local_c4);
    TVector3<float>::operator^(&local_d0,(TVector3<float> *)&m.Y);
    TVector3<float>::operator=(&plane_sv,&local_d0);
    TVector3<float>::operator^(&local_dc,(TVector3<float> *)&n.Y);
    TVector3<float>::operator=(&plane_sz,&local_dc);
    plane_su.Z = (float)((double)plane_su.Z * FocalLengthX);
    plane_sv.Z = (float)((double)plane_sv.Z * FocalLengthX);
    plane_sz.Z = (float)((double)plane_sz.Z * FocalLengthX);
    plane_su.Y = (float)((double)plane_su.Y * IYaspectMul);
    plane_sv.Y = (float)((double)plane_sv.Y * IYaspectMul);
    plane_sz.Y = (float)((double)plane_sz.Y * IYaspectMul);
    TVector3<float>::operator*=(&plane_su,4.2949673e+09);
    TVector3<float>::operator*=(&plane_sv,4.2949673e+09);
    if ((MirrorFlags & 1) != 0) {
      pfVar4 = TVector3<float>::operator[](&plane_su,0);
      fVar3 = *pfVar4;
      pfVar4 = TVector3<float>::operator[](&plane_su,0);
      *pfVar4 = -fVar3;
      pfVar4 = TVector3<float>::operator[](&plane_sv,0);
      fVar3 = *pfVar4;
      pfVar4 = TVector3<float>::operator[](&plane_sv,0);
      *pfVar4 = -fVar3;
      pfVar4 = TVector3<float>::operator[](&plane_sz,0);
      fVar3 = *pfVar4;
      pfVar4 = TVector3<float>::operator[](&plane_sz,0);
      *pfVar4 = -fVar3;
    }
    dVar5 = (double)r_TiltVisibility;
    TVector2<double>::TVector2((TVector2<double> *)local_f0,&ViewPos);
    dVar6 = secplane_t::ZatPoint(&pl->height,(DVector2 *)local_f0);
    planelightfloat =
         (float)(((dVar5 * _xscale * (double)fVar1 * _yscale * (double)fVar2) /
                 ABS(dVar6 - ViewPos.Z)) / 65536.0);
    dVar5 = secplane_t::fC(&pl->height);
    if (0.0 < dVar5) {
      planelightfloat = -planelightfloat;
    }
    if (fixedlightlev < 0) {
      plane_shade = fixedcolormap == (lighttable_t *)0x0;
      if (plane_shade) {
        ds_colormap = basecolormap->Maps;
      }
      else {
        ds_colormap = fixedcolormap;
      }
    }
    else {
      ds_colormap = basecolormap->Maps + fixedlightlev;
      plane_shade = false;
    }
    if (plane_shade == false) {
      for (local_f4 = 0; local_f4 < viewwidth; local_f4 = local_f4 + 1) {
        tiltlighting[local_f4] = ds_colormap;
      }
    }
    R_MapVisPlane(pl,R_MapTiltedPlane);
  }
  return;
}

Assistant:

void R_DrawTiltedPlane (visplane_t *pl, double _xscale, double _yscale, fixed_t alpha, bool additive, bool masked)
{
	static const float ifloatpow2[16] =
	{
		// ifloatpow2[i] = 1 / (1 << i)
		64.f, 32.f, 16.f, 8.f, 4.f, 2.f, 1.f, 0.5f,
		0.25f, 0.125f, 0.0625f, 0.03125f, 0.015625f, 0.0078125f,
		0.00390625f, 0.001953125f
		/*, 0.0009765625f, 0.00048828125f, 0.000244140625f,
		1.220703125e-4f, 6.103515625e-5, 3.0517578125e-5*/
	};
	double lxscale, lyscale;
	double xscale, yscale;
	FVector3 p, m, n;
	double ang, planeang, cosine, sine;
	double zeroheight;

	if (alpha <= 0)
	{
		return;
	}

	lxscale = _xscale * ifloatpow2[ds_xbits];
	lyscale = _yscale * ifloatpow2[ds_ybits];
	xscale = 64.f / lxscale;
	yscale = 64.f / lyscale;
	zeroheight = pl->height.ZatPoint(ViewPos);

	pviewx = xs_ToFixed(32 - ds_xbits, pl->xform.xOffs * pl->xform.xScale);
	pviewy = xs_ToFixed(32 - ds_ybits, pl->xform.yOffs * pl->xform.yScale);
	planeang = (pl->xform.Angle + pl->xform.baseAngle).Radians();

	// p is the texture origin in view space
	// Don't add in the offsets at this stage, because doing so can result in
	// errors if the flat is rotated.
	ang = M_PI*3/2 - ViewAngle.Radians();
	cosine = cos(ang), sine = sin(ang);
	p[0] = ViewPos.X * cosine - ViewPos.Y * sine;
	p[2] = ViewPos.X * sine + ViewPos.Y * cosine;
	p[1] = pl->height.ZatPoint(0.0, 0.0) - ViewPos.Z;

	// m is the v direction vector in view space
	ang = ang - M_PI / 2 - planeang;
	cosine = cos(ang), sine = sin(ang);
	m[0] = yscale * cosine;
	m[2] = yscale * sine;
//	m[1] = pl->height.ZatPointF (0, iyscale) - pl->height.ZatPointF (0,0));
//	VectorScale2 (m, 64.f/VectorLength(m));

	// n is the u direction vector in view space
#if 0
	//let's use the sin/cosine we already know instead of computing new ones
	ang += M_PI/2
	n[0] = -xscale * cos(ang);
	n[2] = -xscale * sin(ang);
#else
	n[0] = xscale * sine;
	n[2] = -xscale * cosine;
#endif
//	n[1] = pl->height.ZatPointF (ixscale, 0) - pl->height.ZatPointF (0,0));
//	VectorScale2 (n, 64.f/VectorLength(n));

	// This code keeps the texture coordinates constant across the x,y plane no matter
	// how much you slope the surface. Use the commented-out code above instead to keep
	// the textures a constant size across the surface's plane instead.
	cosine = cos(planeang), sine = sin(planeang);
	m[1] = pl->height.ZatPoint(ViewPos.X + yscale * sine, ViewPos.Y + yscale * cosine) - zeroheight;
	n[1] = -(pl->height.ZatPoint(ViewPos.X - xscale * cosine, ViewPos.Y + xscale * sine) - zeroheight);

	plane_su = p ^ m;
	plane_sv = p ^ n;
	plane_sz = m ^ n;

	plane_su.Z *= FocalLengthX;
	plane_sv.Z *= FocalLengthX;
	plane_sz.Z *= FocalLengthX;

	plane_su.Y *= IYaspectMul;
	plane_sv.Y *= IYaspectMul;
	plane_sz.Y *= IYaspectMul;

	// Premultiply the texture vectors with the scale factors
	plane_su *= 4294967296.f;
	plane_sv *= 4294967296.f;

	if (MirrorFlags & RF_XFLIP)
	{
		plane_su[0] = -plane_su[0];
		plane_sv[0] = -plane_sv[0];
		plane_sz[0] = -plane_sz[0];
	}

	planelightfloat = (r_TiltVisibility * lxscale * lyscale) / (fabs(pl->height.ZatPoint(ViewPos) - ViewPos.Z)) / 65536.f;

	if (pl->height.fC() > 0)
		planelightfloat = -planelightfloat;

	if (fixedlightlev >= 0)
		ds_colormap = basecolormap->Maps + fixedlightlev, plane_shade = false;
	else if (fixedcolormap)
		ds_colormap = fixedcolormap, plane_shade = false;
	else
		ds_colormap = basecolormap->Maps, plane_shade = true;

	if (!plane_shade)
	{
		for (int i = 0; i < viewwidth; ++i)
		{
			tiltlighting[i] = ds_colormap;
		}
	}

#if defined(X86_ASM)
	if (ds_source != ds_curtiltedsource)
		R_SetTiltedSpanSource_ASM (ds_source);
	R_MapVisPlane (pl, R_DrawTiltedPlane_ASM);
#else
	R_MapVisPlane (pl, R_MapTiltedPlane);
#endif
}